

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

void __thiscall Compiler::writeSymTab(Compiler *this)

{
  _Hash_node_base *p_Var1;
  long *plVar2;
  ostream *poVar3;
  SymbolTable *pSVar4;
  long *plVar5;
  __node_base *p_Var6;
  _Hash_node_base *p_Var7;
  Function **f;
  _Hash_node_base *p_Var8;
  string fileName;
  ofstream stream;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  extractFileName_abi_cxx11_(&local_250,this);
  std::operator+(&local_270,"Output/",&local_250);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_270);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_280 = *plVar5;
    lStack_278 = plVar2[3];
    local_290 = &local_280;
  }
  else {
    local_280 = *plVar5;
    local_290 = (long *)*plVar2;
  }
  local_288 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::ofstream::ofstream(&local_230,(string *)&local_290,_S_out);
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  p_Var6 = &(this->symTabGenerator->symbolTable->classes)._M_h._M_before_begin;
  while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
    poVar3 = operator<<((ostream *)&local_230,(Class *)p_Var6[5]._M_nxt);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  }
  pSVar4 = this->symTabGenerator->symbolTable;
  p_Var7 = (pSVar4->freeFunctions)._M_h._M_before_begin._M_nxt;
  if (p_Var7 != (_Hash_node_base *)0x0) {
    do {
      p_Var1 = p_Var7[6]._M_nxt;
      for (p_Var8 = p_Var7[5]._M_nxt; p_Var8 != p_Var1; p_Var8 = p_Var8 + 1) {
        poVar3 = operator<<((ostream *)&local_230,(Function *)p_Var8->_M_nxt);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      }
      p_Var7 = p_Var7->_M_nxt;
    } while (p_Var7 != (_Hash_node_base *)0x0);
    pSVar4 = this->symTabGenerator->symbolTable;
  }
  poVar3 = operator<<((ostream *)&local_230,pSVar4->main);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Compiler::writeSymTab() {
    std::string fileName = extractFileName();
    std::ofstream stream("Output/" + fileName + "_symtab.txt");
    for (const auto &c : symTabGenerator->symbolTable->classes) stream << *c.second << "\n";

    for (const auto &functions : symTabGenerator->symbolTable->freeFunctions) {
        for (const auto &f : functions.second) stream << *f << "\n";
    }

    stream << *(symTabGenerator->symbolTable->main) << "\n";

    stream.close();
}